

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O1

int __thiscall spdlog::details::file_helper::close(file_helper *this,int __fd)

{
  uint uVar1;
  FILE *pFVar2;
  FILE *local_10;
  
  pFVar2 = this->fd_;
  if (pFVar2 != (FILE *)0x0) {
    if ((this->event_handlers_).before_close.super__Function_base._M_manager != (_Manager_type)0x0)
    {
      local_10 = pFVar2;
      (*(this->event_handlers_).before_close._M_invoker)
                ((_Any_data *)&(this->event_handlers_).before_close,&this->filename_,&local_10);
    }
    uVar1 = fclose((FILE *)this->fd_);
    pFVar2 = (FILE *)(ulong)uVar1;
    this->fd_ = (FILE *)0x0;
    if ((this->event_handlers_).after_close.super__Function_base._M_manager != (_Manager_type)0x0) {
      pFVar2 = (FILE *)(*(this->event_handlers_).after_close._M_invoker)
                                 ((_Any_data *)&(this->event_handlers_).after_close,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&this->filename_);
    }
  }
  return (int)pFVar2;
}

Assistant:

SPDLOG_INLINE void file_helper::close() {
    if (fd_ != nullptr) {
        if (event_handlers_.before_close) {
            event_handlers_.before_close(filename_, fd_);
        }

        std::fclose(fd_);
        fd_ = nullptr;

        if (event_handlers_.after_close) {
            event_handlers_.after_close(filename_);
        }
    }
}